

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53lxx.cpp
# Opt level: O2

void __thiscall VL53LXX::powerOn(VL53LXX *this)

{
  char cVar1;
  runtime_error *this_00;
  allocator local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ofstream file;
  int aiStack_200 [120];
  
  initGPIO(this);
  if (-1 < this->xshutGPIOPin) {
    std::mutex::lock(&this->fileAccessMutex);
    std::ofstream::ofstream(&file);
    std::ofstream::open((char *)&file,(_Ios_Openmode)(this->gpioFilename)._M_dataplus._M_p);
    cVar1 = std::__basic_file<char>::is_open();
    if ((cVar1 == '\0') || (*(int *)((long)aiStack_200 + *(long *)(_file + -0x18)) != 0)) {
      std::ofstream::close();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_260,"Failed opening file: ",&local_261);
      std::operator+(&local_240,&local_260,&this->gpioFilename);
      std::runtime_error::runtime_error(this_00,(string *)&local_240);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator<<((ostream *)&file,"1");
    std::ofstream::close();
    usleep(2000);
    std::ofstream::~ofstream(&file);
    pthread_mutex_unlock((pthread_mutex_t *)&this->fileAccessMutex);
  }
  return;
}

Assistant:

void VL53LXX::powerOn() {
	this->initGPIO();

	if (this->xshutGPIOPin >= 0) {
		std::lock_guard<std::mutex> guard(this->fileAccessMutex);
		std::ofstream file;

		file.open(this->gpioFilename.c_str(), std::ofstream::out);
		if (!file.is_open() || !file.good()) {
			file.close();
			throw(std::runtime_error(std::string("Failed opening file: ") + this->gpioFilename));
		}
		file << "1";
		file.close();

		// t_boot is 1.2ms max, wait 2ms just to be sure
		usleep(2000);
	}
}